

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

void __thiscall icu_63::UnicodeSet::swapBuffers(UnicodeSet *this)

{
  int32_t iVar1;
  UChar32 *pUVar2;
  int32_t c;
  UChar32 *temp;
  UnicodeSet *this_local;
  
  pUVar2 = this->list;
  this->list = this->buffer;
  this->buffer = pUVar2;
  iVar1 = this->capacity;
  this->capacity = this->bufferCapacity;
  this->bufferCapacity = iVar1;
  return;
}

Assistant:

void UnicodeSet::swapBuffers(void) {
    // swap list and buffer
    UChar32* temp = list;
    list = buffer;
    buffer = temp;

    int32_t c = capacity;
    capacity = bufferCapacity;
    bufferCapacity = c;
}